

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_file.c
# Opt level: O0

int nni_plat_file_get(char *name,void **datap,size_t *lenp)

{
  int iVar1;
  int *piVar2;
  size_t sVar3;
  void *local_d8;
  void *data;
  size_t len;
  undefined1 local_c0 [4];
  int rv;
  stat st;
  FILE *f;
  size_t *lenp_local;
  void **datap_local;
  char *name_local;
  
  len._4_4_ = 0;
  st.__glibc_reserved[2] = (__syscall_slong_t)fopen(name,"rb");
  if ((FILE *)st.__glibc_reserved[2] == (FILE *)0x0) {
    piVar2 = __errno_location();
    iVar1 = nni_plat_errno(*piVar2);
    return iVar1;
  }
  iVar1 = stat(name,(stat *)local_c0);
  if (iVar1 != 0) {
    piVar2 = __errno_location();
    iVar1 = nni_plat_errno(*piVar2);
    fclose((FILE *)st.__glibc_reserved[2]);
    return iVar1;
  }
  if (st.st_rdev == 0) {
    local_d8 = (void *)0x0;
  }
  else {
    local_d8 = nni_alloc(st.st_rdev);
    if (local_d8 == (void *)0x0) {
      len._4_4_ = 2;
      goto LAB_0015669f;
    }
    sVar3 = fread(local_d8,1,st.st_rdev,(FILE *)st.__glibc_reserved[2]);
    if (sVar3 != st.st_rdev) {
      piVar2 = __errno_location();
      len._4_4_ = nni_plat_errno(*piVar2);
      nni_free(local_d8,st.st_rdev);
      goto LAB_0015669f;
    }
  }
  *datap = local_d8;
  *lenp = st.st_rdev;
LAB_0015669f:
  fclose((FILE *)st.__glibc_reserved[2]);
  return len._4_4_;
}

Assistant:

int
nni_plat_file_get(const char *name, void **datap, size_t *lenp)
{
	FILE *      f;
	struct stat st;
	int         rv = 0;
	size_t      len;
	void *      data;

	if ((f = fopen(name, "rb")) == NULL) {
		return (nni_plat_errno(errno));
	}

	if (stat(name, &st) != 0) {
		rv = nni_plat_errno(errno);
		(void) fclose(f);
		return (rv);
	}

	len = st.st_size;
	if (len > 0) {
		if ((data = nni_alloc(len)) == NULL) {
			rv = NNG_ENOMEM;
			goto done;
		}
		if (fread(data, 1, len, f) != len) {
			rv = nni_plat_errno(errno);
			nni_free(data, len);
			goto done;
		}
	} else {
		data = NULL;
	}
	*datap = data;
	*lenp  = len;
done:
	(void) fclose(f);
	return (rv);
}